

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void checkShaderError(GLuint shader)

{
  ulong uVar1;
  uint in_EAX;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  undefined4 in_register_0000003c;
  GLint logSize;
  GLint success;
  
  _logSize = (ulong)in_EAX;
  (*__glewGetShaderiv)(CONCAT44(in_register_0000003c,shader),0x8b81,&success);
  if (success == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Shader Compile Failed.");
    std::endl<char,std::char_traits<char>>(poVar3);
    _logSize = _logSize & 0xffffffff00000000;
    (*__glewGetShaderiv)(shader,0x8b84,&logSize);
    uVar1 = _logSize;
    if (logSize == 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"No log found.");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    else {
      iVar2 = -1;
      if (-1 < logSize) {
        iVar2 = logSize;
      }
      pcVar4 = (char *)operator_new__((long)iVar2);
      (*__glewGetShaderInfoLog)(shader,uVar1 & 0xffffffff,&logSize,pcVar4);
      poVar3 = std::operator<<((ostream *)&std::cout,pcVar4);
      std::endl<char,std::char_traits<char>>(poVar3);
      operator_delete__(pcVar4);
    }
  }
  return;
}

Assistant:

void checkShaderError(GLuint shader) {
    GLint success = 0;
    glGetShaderiv(shader, GL_COMPILE_STATUS, &success);
    if (success) return;

    cout << "Shader Compile Failed." << endl;

    GLint logSize = 0;
    glGetShaderiv(shader, GL_INFO_LOG_LENGTH, &logSize);
    if (logSize == 0) {
        cout << "No log found." << endl;
        return;
    }

    GLchar *log = new GLchar[logSize];

    glGetShaderInfoLog(shader, logSize, &logSize, log);

    cout << log << endl;

    delete[] log;
}